

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::DecimalFormat
          (DecimalFormat *this,UnicodeString *pattern,DecimalFormatSymbols *symbolsToAdopt,
          UErrorCode *status)

{
  DecimalFormat(this,symbolsToAdopt,status);
  setPropertiesFromPattern(this,pattern,1,status);
  touch(this,status);
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const UnicodeString& pattern, DecimalFormatSymbols* symbolsToAdopt,
                             UErrorCode& status)
        : DecimalFormat(symbolsToAdopt, status) {
    setPropertiesFromPattern(pattern, IGNORE_ROUNDING_IF_CURRENCY, status);
    touch(status);
}